

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UnicodeFullTest_starts_withi_Test<std::pair<char8_t,_char16_t>_>::TestBody
          (UnicodeFullTest_starts_withi_Test<std::pair<char8_t,_char16_t>_> *this)

{
  bool bVar1;
  char *pcVar2;
  char32_t (*in_RDX) [5];
  char32_t (*in_string) [5];
  char32_t (*in_string_00) [5];
  char32_t (*in_string_01) [5];
  char32_t (*in_string_02) [5];
  char32_t (*in_string_03) [5];
  char32_t (*in_string_04) [5];
  char32_t (*in_string_05) [5];
  char32_t (*in_string_06) [5];
  char32_t (*in_string_07) [5];
  char32_t (*in_string_08) [5];
  char32_t (*in_string_09) [7];
  char32_t (*in_string_10) [5];
  char32_t (*in_string_11) [7];
  char32_t (*in_string_12) [5];
  char32_t (*in_string_13) [7];
  char32_t (*in_string_14) [5];
  char32_t (*in_string_15) [7];
  char32_t (*in_string_16) [5];
  char32_t (*in_string_17) [7];
  char32_t (*in_string_18) [7];
  char32_t (*in_string_19) [5];
  char32_t (*in_string_20) [7];
  char32_t (*in_string_21) [5];
  char32_t (*in_string_22) [7];
  char32_t (*in_string_23) [5];
  char32_t (*in_string_24) [7];
  char32_t (*in_string_25) [5];
  char32_t (*in_string_26) [7];
  char32_t (*in_string_27) [5];
  char32_t (*in_string_28) [20];
  char32_t (*in_string_29) [4];
  char32_t (*in_string_30) [20];
  char32_t (*in_string_31) [9];
  char32_t (*in_string_32) [20];
  char32_t (*in_string_33) [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  AssertHelper local_990 [8];
  Message local_988 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_980;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_960;
  bool local_939;
  undefined1 local_938 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_908 [8];
  Message local_900 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_8f8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_8d8;
  bool local_8b1;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_880 [8];
  Message local_878 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_870;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_850;
  bool local_829;
  undefined1 local_828 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_7f8 [8];
  Message local_7f0 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_7e8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_7c8;
  bool local_7a1;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_770 [8];
  Message local_768 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_760;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_740;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_6e8 [8];
  Message local_6e0 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_6d8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_6b8;
  bool local_691;
  undefined1 local_690 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_660 [8];
  Message local_658 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_650;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_630;
  bool local_609;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_5d8 [8];
  Message local_5d0 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_5c8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_5a8;
  bool local_581;
  undefined1 local_580 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_550 [8];
  Message local_548 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_540;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_520;
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_4c8 [8];
  Message local_4c0 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_4b8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_498;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_440 [8];
  Message local_438 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_430;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_410;
  bool local_3e9;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_3b8 [8];
  Message local_3b0 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_3a8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_388;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_330 [8];
  Message local_328 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_320;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_300;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2a8 [8];
  Message local_2a0 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_298;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_278;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_220 [8];
  Message local_218 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_210;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_1f0;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_198 [8];
  Message local_190 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_188;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_168;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_110 [8];
  Message local_108 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_100;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_e0;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88 [8];
  Message local_80 [24];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_68;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_48;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  UnicodeFullTest_starts_withi_Test<std::pair<char8_t,_char16_t>_> *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  jessilib::string_cast<char8_t,char32_t[5]>(&local_48,(jessilib *)L"ABCD",in_RDX);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_68,(jessilib *)L"ABCD",in_string);
  local_21 = jessilib::starts_withi<char8_t,char16_t>(&local_48,&local_68);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  std::__cxx11::u16string::~u16string((u16string *)&local_68);
  std::__cxx11::u8string::~u8string((u8string *)&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_20,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=(local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_e0,(jessilib *)L"abcd",in_string_00);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_100,(jessilib *)L"abcd",in_string_01);
  local_b9 = jessilib::starts_withi<char8_t,char16_t>(&local_e0,&local_100);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  std::__cxx11::u16string::~u16string((u16string *)&local_100);
  std::__cxx11::u8string::~u8string((u8string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_b8,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xfa,pcVar2);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_168,(jessilib *)L"ABCD",in_string_02);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_188,(jessilib *)L"abcd",in_string_03);
  local_141 = jessilib::starts_withi<char8_t,char16_t>(&local_168,&local_188);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_188);
  std::__cxx11::u8string::~u8string((u8string *)&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__3.message_,local_140,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xfc,pcVar2);
    testing::internal::AssertHelper::operator=(local_198,local_190);
    testing::internal::AssertHelper::~AssertHelper(local_198);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_1f0,(jessilib *)L"abcd",in_string_04);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_210,(jessilib *)L"ABCD",in_string_05);
  local_1c9 = jessilib::starts_withi<char8_t,char16_t>(&local_1f0,&local_210);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_210);
  std::__cxx11::u8string::~u8string((u8string *)&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_1c8,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=(local_220,local_218);
    testing::internal::AssertHelper::~AssertHelper(local_220);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_278,(jessilib *)L"ABcd",in_string_06);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_298,(jessilib *)L"abCD",in_string_07);
  local_251 = jessilib::starts_withi<char8_t,char16_t>(&local_278,&local_298);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_298);
  std::__cxx11::u8string::~u8string((u8string *)&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__5.message_,local_250,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=(local_2a8,local_2a0);
    testing::internal::AssertHelper::~AssertHelper(local_2a8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_300,(jessilib *)L"ABCD",in_string_08);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_320,(jessilib *)L"ABCDzz",in_string_09);
  bVar1 = jessilib::starts_withi<char8_t,char16_t>(&local_300,&local_320);
  local_2d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_320);
  std::__cxx11::u8string::~u8string((u8string *)&local_300);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(local_328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__6.message_,local_2d8,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCDzz\"))"
               ,"true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x104,pcVar2);
    testing::internal::AssertHelper::operator=(local_330,local_328);
    testing::internal::AssertHelper::~AssertHelper(local_330);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_388,(jessilib *)L"abcd",in_string_10);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_3a8,(jessilib *)L"abcdzz",in_string_11);
  bVar1 = jessilib::starts_withi<char8_t,char16_t>(&local_388,&local_3a8);
  local_361 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_3a8);
  std::__cxx11::u8string::~u8string((u8string *)&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__7.message_,local_360,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcdzz\"))"
               ,"true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x106,pcVar2);
    testing::internal::AssertHelper::operator=(local_3b8,local_3b0);
    testing::internal::AssertHelper::~AssertHelper(local_3b8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_410,(jessilib *)L"ABCD",in_string_12);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_430,(jessilib *)L"abcdzz",in_string_13);
  bVar1 = jessilib::starts_withi<char8_t,char16_t>(&local_410,&local_430);
  local_3e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e8,&local_3e9,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_430);
  std::__cxx11::u8string::~u8string((u8string *)&local_410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__8.message_,local_3e8,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcdzz\"))"
               ,"true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x108,pcVar2);
    testing::internal::AssertHelper::operator=(local_440,local_438);
    testing::internal::AssertHelper::~AssertHelper(local_440);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_498,(jessilib *)L"abcd",in_string_14);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_4b8,(jessilib *)L"ABCDzz",in_string_15);
  bVar1 = jessilib::starts_withi<char8_t,char16_t>(&local_498,&local_4b8);
  local_471 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_470,&local_471,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_4b8);
  std::__cxx11::u8string::~u8string((u8string *)&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__9.message_,local_470,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCDzz\"))"
               ,"true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=(local_4c8,local_4c0);
    testing::internal::AssertHelper::~AssertHelper(local_4c8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_520,(jessilib *)L"ABcd",in_string_16);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_540,(jessilib *)L"abCDzz",in_string_17);
  bVar1 = jessilib::starts_withi<char8_t,char16_t>(&local_520,&local_540);
  local_4f9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f8,&local_4f9,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_540);
  std::__cxx11::u8string::~u8string((u8string *)&local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(local_548);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__10.message_,local_4f8,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCDzz\"))"
               ,"true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x10c,pcVar2);
    testing::internal::AssertHelper::operator=(local_550,local_548);
    testing::internal::AssertHelper::~AssertHelper(local_550);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  jessilib::string_cast<char8_t,char32_t[7]>(&local_5a8,(jessilib *)L"ABCDzz",in_string_18);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_5c8,(jessilib *)L"ABCD",in_string_19);
  local_581 = jessilib::starts_withi<char8_t,char16_t>(&local_5a8,&local_5c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_580,&local_581,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_5c8);
  std::__cxx11::u8string::~u8string((u8string *)&local_5a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__11.message_,local_580,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCDzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_5d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x110,pcVar2);
    testing::internal::AssertHelper::operator=(local_5d8,local_5d0);
    testing::internal::AssertHelper::~AssertHelper(local_5d8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_5d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  jessilib::string_cast<char8_t,char32_t[7]>(&local_630,(jessilib *)L"abcdzz",in_string_20);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_650,(jessilib *)L"abcd",in_string_21);
  local_609 = jessilib::starts_withi<char8_t,char16_t>(&local_630,&local_650);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_608,&local_609,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_650);
  std::__cxx11::u8string::~u8string((u8string *)&local_630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar1) {
    testing::Message::Message(local_658);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__12.message_,local_608,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x112,pcVar2);
    testing::internal::AssertHelper::operator=(local_660,local_658);
    testing::internal::AssertHelper::~AssertHelper(local_660);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  jessilib::string_cast<char8_t,char32_t[7]>(&local_6b8,(jessilib *)L"ABCDzz",in_string_22);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_6d8,(jessilib *)L"abcd",in_string_23);
  local_691 = jessilib::starts_withi<char8_t,char16_t>(&local_6b8,&local_6d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_690,&local_691,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_6d8);
  std::__cxx11::u8string::~u8string((u8string *)&local_6b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar1) {
    testing::Message::Message(local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__13.message_,local_690,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCDzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__13.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x114,pcVar2);
    testing::internal::AssertHelper::operator=(local_6e8,local_6e0);
    testing::internal::AssertHelper::~AssertHelper(local_6e8);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  jessilib::string_cast<char8_t,char32_t[7]>(&local_740,(jessilib *)L"abcdzz",in_string_24);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_760,(jessilib *)L"ABCD",in_string_25);
  local_719 = jessilib::starts_withi<char8_t,char16_t>(&local_740,&local_760);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_760);
  std::__cxx11::u8string::~u8string((u8string *)&local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(local_768);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__14.message_,local_718,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__14.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_770,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=(local_770,local_768);
    testing::internal::AssertHelper::~AssertHelper(local_770);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  jessilib::string_cast<char8_t,char32_t[7]>(&local_7c8,(jessilib *)L"ABcdzz",in_string_26);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_7e8,(jessilib *)L"abCD",in_string_27);
  local_7a1 = jessilib::starts_withi<char8_t,char16_t>(&local_7c8,&local_7e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7a0,&local_7a1,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_7e8);
  std::__cxx11::u8string::~u8string((u8string *)&local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
  if (!bVar1) {
    testing::Message::Message(local_7f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__15.message_,local_7a0,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__15.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=(local_7f8,local_7f0);
    testing::internal::AssertHelper::~AssertHelper(local_7f8);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
  jessilib::string_cast<char8_t,char32_t[20]>
            (&local_850,(jessilib *)L"Les Bean del Dallas",in_string_28);
  jessilib::string_cast<char16_t,char32_t[4]>(&local_870,(jessilib *)L"les",in_string_29);
  local_829 = jessilib::starts_withi<char8_t,char16_t>(&local_850,&local_870);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_828,&local_829,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_870);
  std::__cxx11::u8string::~u8string((u8string *)&local_850);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
  if (!bVar1) {
    testing::Message::Message(local_878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__16.message_,local_828,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"Les Bean del Dallas\"), jessilib::string_cast<typename TypeParam::second_type>(U\"les\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__16.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=(local_880,local_878);
    testing::internal::AssertHelper::~AssertHelper(local_880);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
  jessilib::string_cast<char8_t,char32_t[20]>
            (&local_8d8,(jessilib *)L"Les Bean del Dallas",in_string_30);
  jessilib::string_cast<char16_t,char32_t[9]>(&local_8f8,(jessilib *)L"les Bean",in_string_31);
  local_8b1 = jessilib::starts_withi<char8_t,char16_t>(&local_8d8,&local_8f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8b0,&local_8b1,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_8f8);
  std::__cxx11::u8string::~u8string((u8string *)&local_8d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar1) {
    testing::Message::Message(local_900);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__17.message_,local_8b0,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"Les Bean del Dallas\"), jessilib::string_cast<typename TypeParam::second_type>(U\"les Bean\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__17.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_908,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x11d,pcVar2);
    testing::internal::AssertHelper::operator=(local_908,local_900);
    testing::internal::AssertHelper::~AssertHelper(local_908);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(local_900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  jessilib::string_cast<char8_t,char32_t[20]>
            (&local_960,(jessilib *)L"Les Bean del Dallas",in_string_32);
  jessilib::string_cast<char16_t,char32_t[4]>(&local_980,(jessilib *)L"del",in_string_33);
  bVar1 = jessilib::starts_withi<char8_t,char16_t>(&local_960,&local_980);
  local_939 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_938,&local_939,(type *)0x0);
  std::__cxx11::u16string::~u16string((u16string *)&local_980);
  std::__cxx11::u8string::~u8string((u8string *)&local_960);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_938);
  if (!bVar1) {
    testing::Message::Message(local_988);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_9b0,local_938,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"Les Bean del Dallas\"), jessilib::string_cast<typename TypeParam::second_type>(U\"del\"))"
               ,"true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_9b0);
    testing::internal::AssertHelper::AssertHelper
              (local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x11f,pcVar2);
    testing::internal::AssertHelper::operator=(local_990,local_988);
    testing::internal::AssertHelper::~AssertHelper(local_990);
    std::__cxx11::string::~string((string *)&local_9b0);
    testing::Message::~Message(local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_938);
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, starts_withi) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));

	// TypeParam::first_type starts_with TypeParam::second_type... (always false)
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCDzz")));

	// TypeParam::first_type... starts_with TypeParam::second_type (always same results as first)
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));

	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"Les Bean del Dallas"),
		jessilib::string_cast<typename TypeParam::second_type>(U"les")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"Les Bean del Dallas"),
		jessilib::string_cast<typename TypeParam::second_type>(U"les Bean")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"Les Bean del Dallas"),
		jessilib::string_cast<typename TypeParam::second_type>(U"del")));
}